

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O0

void crec_index_bf(jit_State *J,RecordFFData *rd,TRef ptr,CTInfo info)

{
  ushort uVar1;
  IRRef1 IVar2;
  uint uVar3;
  TRef TVar4;
  uint uVar5;
  int iVar6;
  TRef TVar7;
  byte bVar8;
  uint local_19c;
  TRef sp;
  int32_t mask;
  CType *ct;
  CTState *cts;
  CTSize shift;
  CTSize bsz;
  CTSize pos;
  TRef tr;
  IRType t;
  CTInfo info_local;
  TRef ptr_local;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  uVar3 = info >> 0x10 & 0x7f;
  iVar6 = 0x1f;
  if (uVar3 != 0) {
    for (; uVar3 >> iVar6 == 0; iVar6 = iVar6 + -1) {
    }
  }
  uVar1 = (short)iVar6 * 2 + 0xf + (ushort)((info & 0x800000) != 0);
  (J->fold).ins.field_0.ot = uVar1 | 0x4600;
  (J->fold).ins.field_0.op1 = (IRRef1)ptr;
  (J->fold).ins.field_0.op2 = 0;
  TVar4 = lj_opt_fold(J);
  uVar3 = info & 0x7f;
  uVar5 = info >> 8 & 0x7f;
  iVar6 = 0x20 - uVar5;
  IVar2 = (IRRef1)TVar4;
  bVar8 = (byte)uVar5;
  if (rd->data == 0) {
    if ((info & 0x8000000) == 0) {
      if ((info & 0x800000) == 0) {
        TVar4 = lj_ir_kint(J,iVar6 - uVar3);
        (J->fold).ins.field_0.ot = 0x2413;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
        TVar4 = lj_opt_fold(J);
        TVar7 = lj_ir_kint(J,iVar6);
        (J->fold).ins.field_0.ot = 0x2613;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        bsz = lj_opt_fold(J);
      }
      else {
        TVar4 = lj_ir_kint(J,uVar3);
        (J->fold).ins.field_0.ot = 0x2513;
        (J->fold).ins.field_0.op1 = IVar2;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
        TVar4 = lj_opt_fold(J);
        TVar7 = lj_ir_kint(J,(1 << (bVar8 & 0x1f)) + -1);
        (J->fold).ins.field_0.ot = 0x2113;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
        bsz = lj_opt_fold(J);
      }
    }
    else {
      TVar4 = lj_ir_kint(J,1 << ((byte)uVar3 & 0x1f));
      (J->fold).ins.field_0.ot = 0x2113;
      (J->fold).ins.field_0.op1 = IVar2;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      TVar4 = lj_opt_fold(J);
      TVar7 = lj_ir_kint(J,0);
      (J->fold).ins.field_0.ot = 0x993;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
      J->postproc = LJ_POST_FIXGUARD;
      bsz = 0x2007ffd;
    }
    *J->base = bsz;
  }
  else {
    if ((info & 0x8000000) == 0) {
      local_19c = 9;
      if ((info & 0x800000) != 0) {
        local_19c = 10;
      }
    }
    else {
      local_19c = 3;
    }
    uVar5 = (1 << (bVar8 & 0x1f)) + -1 << ((byte)uVar3 & 0x1f);
    TVar4 = crec_ct_tv(J,(CType *)(**(long **)&J[-1].penalty[0x3c].val + (ulong)local_19c * 0x18),0,
                       J->base[2],rd->argv + 2);
    TVar7 = lj_ir_kint(J,uVar3);
    (J->fold).ins.field_0.ot = 0x2413;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    TVar4 = lj_opt_fold(J);
    TVar7 = lj_ir_kint(J,uVar5);
    (J->fold).ins.field_0.ot = uVar1 | 0x2100;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar4;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    TVar4 = lj_opt_fold(J);
    TVar7 = lj_ir_kint(J,uVar5 ^ 0xffffffff);
    (J->fold).ins.field_0.ot = uVar1 | 0x2100;
    (J->fold).ins.field_0.op1 = IVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar7;
    TVar7 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar1 | 0x2200;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar7;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    TVar4 = lj_opt_fold(J);
    (J->fold).ins.field_0.ot = uVar1 | 0x4e00;
    (J->fold).ins.field_0.op1 = (IRRef1)ptr;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
    lj_opt_fold(J);
    rd->nres = 0;
    J->needsnap = '\x01';
  }
  return;
}

Assistant:

static void crec_index_bf(jit_State *J, RecordFFData *rd, TRef ptr, CTInfo info)
{
  IRType t = IRT_I8 + 2*lj_fls(ctype_bitcsz(info)) + ((info&CTF_UNSIGNED)?1:0);
  TRef tr = emitir(IRT(IR_XLOAD, t), ptr, 0);
  CTSize pos = ctype_bitpos(info), bsz = ctype_bitbsz(info), shift = 32 - bsz;
  lj_assertJ(t <= IRT_U32, "only 32 bit bitfields supported");  /* NYI */
  if (rd->data == 0) {  /* __index metamethod. */
    if ((info & CTF_BOOL)) {
      tr = emitir(IRTI(IR_BAND), tr, lj_ir_kint(J, (int32_t)((1u << pos))));
      /* Assume not equal to zero. Fixup and emit pending guard later. */
      lj_ir_set(J, IRTGI(IR_NE), tr, lj_ir_kint(J, 0));
      J->postproc = LJ_POST_FIXGUARD;
      tr = TREF_TRUE;
    } else if (!(info & CTF_UNSIGNED)) {
      tr = emitir(IRTI(IR_BSHL), tr, lj_ir_kint(J, shift - pos));
      tr = emitir(IRTI(IR_BSAR), tr, lj_ir_kint(J, shift));
    } else {
      lj_assertJ(bsz < 32, "unexpected full bitfield index");
      tr = emitir(IRTI(IR_BSHR), tr, lj_ir_kint(J, pos));
      tr = emitir(IRTI(IR_BAND), tr, lj_ir_kint(J, (int32_t)((1u << bsz)-1)));
      /* We can omit the U32 to NUM conversion, since bsz < 32. */
    }
    J->base[0] = tr;
  } else {  /* __newindex metamethod. */
    CTState *cts = ctype_ctsG(J2G(J));
    CType *ct = ctype_get(cts,
			  (info & CTF_BOOL) ? CTID_BOOL :
			  (info & CTF_UNSIGNED) ? CTID_UINT32 : CTID_INT32);
    int32_t mask = (int32_t)(((1u << bsz)-1) << pos);
    TRef sp = crec_ct_tv(J, ct, 0, J->base[2], &rd->argv[2]);
    sp = emitir(IRTI(IR_BSHL), sp, lj_ir_kint(J, pos));
    /* Use of the target type avoids forwarding conversions. */
    sp = emitir(IRT(IR_BAND, t), sp, lj_ir_kint(J, mask));
    tr = emitir(IRT(IR_BAND, t), tr, lj_ir_kint(J, (int32_t)~mask));
    tr = emitir(IRT(IR_BOR, t), tr, sp);
    emitir(IRT(IR_XSTORE, t), ptr, tr);
    rd->nres = 0;
    J->needsnap = 1;
  }
}